

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_transform.cc
# Opt level: O2

unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> __thiscall
draco::AttributeTransform::InitTransformedAttribute
          (AttributeTransform *this,PointAttribute *src_attribute,int num_entries)

{
  Type attribute_type;
  pointer pIVar1;
  int iVar2;
  DataType dt;
  int32_t iVar3;
  PointAttribute *this_00;
  int in_ECX;
  undefined4 in_register_00000014;
  long lVar4;
  GeometryAttribute ga;
  
  lVar4 = CONCAT44(in_register_00000014,num_entries);
  iVar2 = (*(code *)(src_attribute->super_GeometryAttribute).buffer_[2].data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish)(src_attribute,lVar4);
  dt = (*(code *)(src_attribute->super_GeometryAttribute).buffer_[2].data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start)(src_attribute,lVar4);
  GeometryAttribute::GeometryAttribute(&ga);
  attribute_type = *(Type *)(lVar4 + 0x38);
  iVar3 = DataTypeLength(dt);
  GeometryAttribute::Init
            (&ga,attribute_type,(DataBuffer *)0x0,(uint8_t)iVar2,dt,false,(long)(iVar3 * iVar2),0);
  this_00 = (PointAttribute *)operator_new(0x70);
  PointAttribute::PointAttribute(this_00,&ga);
  this->_vptr_AttributeTransform = (_func_int **)this_00;
  PointAttribute::Reset(this_00,(long)in_ECX);
  this_00->identity_mapping_ = true;
  pIVar1 = (this_00->indices_map_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this_00->indices_map_).vector_.
      super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar1) {
    (this_00->indices_map_).vector_.
    super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar1;
  }
  (this_00->super_GeometryAttribute).unique_id_ = *(uint32_t *)(lVar4 + 0x3c);
  return (__uniq_ptr_data<draco::PointAttribute,_std::default_delete<draco::PointAttribute>,_true,_true>
          )(__uniq_ptr_data<draco::PointAttribute,_std::default_delete<draco::PointAttribute>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<PointAttribute> AttributeTransform::InitTransformedAttribute(
    const PointAttribute &src_attribute, int num_entries) {
  const int num_components = GetTransformedNumComponents(src_attribute);
  const DataType dt = GetTransformedDataType(src_attribute);
  GeometryAttribute ga;
  ga.Init(src_attribute.attribute_type(), nullptr, num_components, dt, false,
          num_components * DataTypeLength(dt), 0);
  std::unique_ptr<PointAttribute> transformed_attribute(new PointAttribute(ga));
  transformed_attribute->Reset(num_entries);
  transformed_attribute->SetIdentityMapping();
  transformed_attribute->set_unique_id(src_attribute.unique_id());
  return transformed_attribute;
}